

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall
QAbstractItemViewPrivate::addEditor
          (QAbstractItemViewPrivate *this,QModelIndex *index,QWidget *editor,bool isStatic)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  QWidget *copy;
  QPersistentModelIndex QStack_58;
  QEditorInfo local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QPersistentModelIndex::QPersistentModelIndex(&QStack_58,index);
  local_50.widget.wp.d = (Data *)editor;
  QHash<QWidget*,QPersistentModelIndex>::emplace<QPersistentModelIndex_const&>
            ((QHash<QWidget*,QPersistentModelIndex> *)&this->editorIndexHash,(QWidget **)&local_50,
             &QStack_58);
  QPersistentModelIndex::~QPersistentModelIndex(&QStack_58);
  QPersistentModelIndex::QPersistentModelIndex(&QStack_58,index);
  if (editor == (QWidget *)0x0) {
    local_50.widget.wp.d = (Data *)0x0;
  }
  else {
    local_50.widget.wp.d =
         (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&editor->super_QObject);
  }
  local_50.widget.wp.value = &editor->super_QObject;
  local_50.isStatic = isStatic;
  QHash<QPersistentModelIndex,QEditorInfo>::emplace<QEditorInfo_const&>
            ((QHash<QPersistentModelIndex,QEditorInfo> *)&this->indexEditorHash,&QStack_58,&local_50
            );
  if (local_50.widget.wp.d != (Data *)0x0) {
    LOCK();
    *(int *)local_50.widget.wp.d = *(int *)local_50.widget.wp.d + -1;
    UNLOCK();
    if (*(int *)local_50.widget.wp.d == 0) {
      pDVar1 = local_50.widget.wp.d;
      if (local_50.widget.wp.d == (Data *)0x0) {
        pDVar1 = (Data *)0x0;
      }
      operator_delete(pDVar1);
    }
  }
  QPersistentModelIndex::~QPersistentModelIndex(&QStack_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::addEditor(const QModelIndex &index, QWidget *editor, bool isStatic)
{
    editorIndexHash.insert(editor, index);
    indexEditorHash.insert(index, QEditorInfo(editor, isStatic));
}